

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2asc.c
# Opt level: O0

void canfd_asc(canfd_frame *cf,int devno,int mtu,char *extra_info,FILE *outfile)

{
  byte bVar1;
  size_t sVar2;
  char *in_RCX;
  undefined8 uVar3;
  int in_EDX;
  uint in_ESI;
  uint *in_RDI;
  FILE *in_R8;
  can_frame *ccf;
  uint dlc;
  uint dlen;
  uint flags;
  char *dir;
  char id [10];
  uint i;
  uint local_44;
  uint local_40;
  uint local_3c;
  char *local_38;
  char local_2e [10];
  uint local_24;
  FILE *local_20;
  char *local_18;
  int local_10;
  uint local_c;
  uint *local_8;
  
  local_38 = "Rx";
  local_3c = 0;
  local_40 = (uint)(byte)in_RDI[1];
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar1 = can_fd_len2dlc((byte)in_RDI[1]);
  local_44 = (uint)bVar1;
  sVar2 = strlen(local_18);
  if ((sVar2 != 0) && (*local_18 == 'T')) {
    local_38 = "Tx";
  }
  fprintf(local_20,"CANFD %3d %-4s ",(ulong)local_c,local_38);
  uVar3 = 0x20;
  if ((*local_8 & 0x80000000) != 0) {
    uVar3 = 0x78;
  }
  sprintf(local_2e,"%X%c",(ulong)(*local_8 & 0x1fffffff),uVar3);
  fprintf(local_20,"%11s                                  ",local_2e);
  uVar3 = 0x30;
  if ((*(byte *)((long)local_8 + 5) & 1) != 0) {
    uVar3 = 0x31;
  }
  fprintf(local_20,"%c ",uVar3);
  uVar3 = 0x30;
  if ((*(byte *)((long)local_8 + 5) & 2) != 0) {
    uVar3 = 0x31;
  }
  fprintf(local_20,"%c ",uVar3);
  if ((((local_10 == 0x10) && (local_40 == 8)) && (8 < *(byte *)((long)local_8 + 7))) &&
     (*(byte *)((long)local_8 + 7) < 0x10)) {
    local_44 = (uint)*(byte *)((long)local_8 + 7);
  }
  fprintf(local_20,"%x ",(ulong)local_44);
  if (local_10 == 0x10) {
    if ((*local_8 & 0x40000000) != 0) {
      local_40 = 0;
      local_3c = 0x10;
    }
  }
  else {
    local_3c = 0x1000;
    if ((*(byte *)((long)local_8 + 5) & 1) != 0) {
      local_3c = 0x3000;
    }
    if ((*(byte *)((long)local_8 + 5) & 2) != 0) {
      local_3c = local_3c | 0x4000;
    }
  }
  fprintf(local_20,"%2d",(ulong)local_40);
  for (local_24 = 0; local_24 < local_40; local_24 = local_24 + 1) {
    fprintf(local_20," %02X",(ulong)*(byte *)((long)local_8 + (ulong)local_24 + 8));
  }
  fprintf(local_20," %8d %4d %8X 0 0 0 0 0",130000,0x82,(ulong)local_3c);
  return;
}

Assistant:

static void canfd_asc(struct canfd_frame *cf, int devno, int mtu,
		      char *extra_info, FILE *outfile)
{
	unsigned int i;
	char id[10];
	char *dir = "Rx";
	unsigned int flags = 0;
	unsigned int dlen = cf->len;
	unsigned int dlc = can_fd_len2dlc(dlen);

	/* check for extra info */
	if (strlen(extra_info) > 0) {
		/* only the first char is defined so far */
		if (extra_info[0] == 'T')
			dir = "Tx";
	}

	fprintf(outfile, "CANFD %3d %-4s ", devno, dir); /* 3 column channel number right aligned */

	sprintf(id, "%X%c", cf->can_id & CAN_EFF_MASK,
		(cf->can_id & CAN_EFF_FLAG)?'x':' ');
	fprintf(outfile, "%11s                                  ", id);
	fprintf(outfile, "%c ", (cf->flags & CANFD_BRS)?'1':'0');
	fprintf(outfile, "%c ", (cf->flags & CANFD_ESI)?'1':'0');

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if ((mtu == CAN_MTU) && (dlen == CAN_MAX_DLEN)) {
		struct can_frame *ccf = (struct can_frame *)cf;

		if ((ccf->len8_dlc > CAN_MAX_DLEN) && (ccf->len8_dlc <= CAN_MAX_RAW_DLC))
			dlc = ccf->len8_dlc;
	}

	fprintf(outfile, "%x ", dlc);

	if (mtu == CAN_MTU) {
		if (cf->can_id & CAN_RTR_FLAG) {
			/* no data length but dlc for RTR frames */
			dlen = 0;
			flags = ASC_F_RTR;
		}
	} else {
		flags = ASC_F_FDF;
		if (cf->flags & CANFD_BRS)
			flags |= ASC_F_BRS;
		if (cf->flags & CANFD_ESI)
			flags |= ASC_F_ESI;
	}

	fprintf(outfile, "%2d", dlen);

	for (i = 0; i < dlen; i++) {
		fprintf(outfile, " %02X", cf->data[i]);
	}

	fprintf(outfile, " %8d %4d %8X 0 0 0 0 0", 130000, 130, flags);
}